

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void FBaseCVar::EnableCallbacks(void)

{
  FBaseCVar *pFVar1;
  FBaseCVar **ppFVar2;
  
  m_UseCallback = true;
  ppFVar2 = &CVars;
  while (pFVar1 = *ppFVar2, pFVar1 != (FBaseCVar *)0x0) {
    if (((pFVar1->Flags & 0x200) == 0) && (pFVar1->m_Callback != (_func_void_FBaseCVar_ptr *)0x0)) {
      (*pFVar1->m_Callback)(pFVar1);
    }
    ppFVar2 = &pFVar1->m_Next;
  }
  return;
}

Assistant:

void FBaseCVar::EnableCallbacks ()
{
	m_UseCallback = true;
	FBaseCVar *cvar = CVars;

	while (cvar)
	{
		if (!(cvar->Flags & CVAR_NOINITCALL))
		{
			cvar->Callback ();
		}
		cvar = cvar->m_Next;
	}
}